

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O3

void duckdb::SetVectorString<unsigned_long>
               (Vector *vector,idx_t size,char *cdata,unsigned_long *offsets)

{
  char *__src;
  unsigned_long *puVar1;
  unsigned_long uVar2;
  char *pcVar3;
  ConversionException *this;
  ulong __n;
  data_ptr_t pdVar4;
  ulong uVar5;
  string local_58;
  Vector *local_38;
  
  pcVar3 = (char *)CONCAT44((undefined4)local_58._M_string_length,local_58._M_dataplus._M_p._4_4_);
  if (size != 0) {
    pdVar4 = vector->data + 4;
    uVar5 = 0;
    local_38 = vector;
    do {
      puVar1 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar1 == (unsigned_long *)0x0) || ((puVar1[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0)) {
        uVar2 = offsets[uVar5];
        __n = offsets[uVar5 + 1] - uVar2;
        if (__n >> 0x20 != 0) {
          local_58._4_8_ = pcVar3;
          this = (ConversionException *)__cxa_allocate_exception(0x10);
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,"DuckDB does not support Strings over 4GB","");
          ConversionException::ConversionException(this,&local_58);
          __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
        }
        __src = cdata + uVar2;
        if (__n < 0xd) {
          local_58._M_string_length._0_4_ = 0;
          local_58._M_dataplus._M_p._0_4_ = 0;
          local_58._M_dataplus._M_p._4_4_ = 0;
          pcVar3 = (char *)0x0;
          if (offsets[uVar5 + 1] != uVar2) {
            switchD_015df945::default(&local_58,__src,__n);
            vector = local_38;
            pcVar3 = (char *)CONCAT44((undefined4)local_58._M_string_length,
                                      local_58._M_dataplus._M_p._4_4_);
          }
        }
        else {
          local_58._M_dataplus._M_p._0_4_ = *(undefined4 *)__src;
          pcVar3 = __src;
        }
        local_58._M_string_length._0_4_ = (undefined4)((ulong)pcVar3 >> 0x20);
        local_58._M_dataplus._M_p._4_4_ = SUB84(pcVar3,0);
        *(int *)(pdVar4 + -4) = (int)__n;
        *(ulong *)pdVar4 = CONCAT44(local_58._M_dataplus._M_p._4_4_,local_58._M_dataplus._M_p._0_4_)
        ;
        *(undefined4 *)(pdVar4 + 8) = (undefined4)local_58._M_string_length;
      }
      uVar5 = uVar5 + 1;
      pdVar4 = pdVar4 + 0x10;
    } while (size != uVar5);
  }
  return;
}

Assistant:

static void SetVectorString(Vector &vector, idx_t size, char *cdata, T *offsets) {
	auto strings = FlatVector::GetData<string_t>(vector);
	for (idx_t row_idx = 0; row_idx < size; row_idx++) {
		if (FlatVector::IsNull(vector, row_idx)) {
			continue;
		}
		auto cptr = cdata + offsets[row_idx];
		auto str_len = offsets[row_idx + 1] - offsets[row_idx];
		if (str_len > NumericLimits<uint32_t>::Maximum()) { // LCOV_EXCL_START
			throw ConversionException("DuckDB does not support Strings over 4GB");
		} // LCOV_EXCL_STOP
		strings[row_idx] = string_t(cptr, UnsafeNumericCast<uint32_t>(str_len));
	}
}